

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageAtomicOperationTests.cpp
# Opt level: O0

void __thiscall
vkt::image::anon_unknown_2::BinaryAtomicIntermValuesInstance::prepareResources
          (BinaryAtomicIntermValuesInstance *this)

{
  VkImage image;
  PtrData<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_> data;
  VkImageSubresourceRange subresourceRange_00;
  RefData<vk::Handle<(vk::HandleType)13>_> data_00;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  deUint32 layerCount;
  VkImageViewType imageViewType;
  VkFormat format;
  VkDevice device_00;
  DeviceInterface *vk;
  Allocator *allocator_00;
  Image *pIVar4;
  VkImage *pVVar5;
  VkExtent3D VVar6;
  Image *in_stack_fffffffffffffe18;
  undefined8 in_stack_fffffffffffffe20;
  bool local_189;
  bool local_169;
  Move<vk::Handle<(vk::HandleType)13>_> local_140;
  RefData<vk::Handle<(vk::HandleType)13>_> local_120;
  undefined1 auStack_fc [8];
  VkImageSubresourceRange subresourceRange;
  PtrData<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_> local_d0;
  PtrData<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_> *local_c0;
  VkExtent3D local_b0;
  undefined1 local_a0 [8];
  VkImageCreateInfo imageParams;
  UVec3 extendedLayerSize;
  bool isCubeBasedImage;
  UVec3 layerSize;
  Allocator *allocator;
  DeviceInterface *deviceInterface;
  VkDevice device;
  BinaryAtomicIntermValuesInstance *this_local;
  
  device_00 = Context::getDevice((this->super_BinaryAtomicInstanceBase).super_TestInstance.m_context
                                );
  vk = Context::getDeviceInterface
                 ((this->super_BinaryAtomicInstanceBase).super_TestInstance.m_context);
  allocator_00 = Context::getDefaultAllocator
                           ((this->super_BinaryAtomicInstanceBase).super_TestInstance.m_context);
  getLayerSize((image *)(extendedLayerSize.m_data + 2),
               (this->super_BinaryAtomicInstanceBase).m_imageType,
               &(this->super_BinaryAtomicInstanceBase).m_imageSize);
  local_169 = true;
  if ((this->super_BinaryAtomicInstanceBase).m_imageType != IMAGE_TYPE_CUBE) {
    local_169 = (this->super_BinaryAtomicInstanceBase).m_imageType == IMAGE_TYPE_CUBE_ARRAY;
  }
  extendedLayerSize.m_data[1]._3_1_ = local_169;
  if (local_169 == false) {
    uVar1 = tcu::Vector<unsigned_int,_3>::x
                      ((Vector<unsigned_int,_3> *)(extendedLayerSize.m_data + 2));
    uVar2 = tcu::Vector<unsigned_int,_3>::y
                      ((Vector<unsigned_int,_3> *)(extendedLayerSize.m_data + 2));
    uVar3 = tcu::Vector<unsigned_int,_3>::z
                      ((Vector<unsigned_int,_3> *)(extendedLayerSize.m_data + 2));
    tcu::Vector<unsigned_int,_3>::Vector
              ((Vector<unsigned_int,_3> *)&imageParams.field_0x54,uVar1 * 5,uVar2,uVar3);
  }
  else {
    uVar1 = tcu::Vector<unsigned_int,_3>::x
                      ((Vector<unsigned_int,_3> *)(extendedLayerSize.m_data + 2));
    uVar2 = tcu::Vector<unsigned_int,_3>::y
                      ((Vector<unsigned_int,_3> *)(extendedLayerSize.m_data + 2));
    uVar3 = tcu::Vector<unsigned_int,_3>::z
                      ((Vector<unsigned_int,_3> *)(extendedLayerSize.m_data + 2));
    tcu::Vector<unsigned_int,_3>::Vector
              ((Vector<unsigned_int,_3> *)&imageParams.field_0x54,uVar1 * 5,uVar2 * 5,uVar3);
  }
  local_a0._0_4_ = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
  imageParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  imageParams._4_4_ = 0;
  local_189 = true;
  if ((this->super_BinaryAtomicInstanceBase).m_imageType != IMAGE_TYPE_CUBE) {
    local_189 = (this->super_BinaryAtomicInstanceBase).m_imageType == IMAGE_TYPE_CUBE_ARRAY;
  }
  imageParams.pNext._0_4_ = (uint)local_189 << 4;
  imageParams.pNext._4_4_ = mapImageType((this->super_BinaryAtomicInstanceBase).m_imageType);
  imageParams.flags = ::vk::mapTextureFormat(&(this->super_BinaryAtomicInstanceBase).m_format);
  VVar6 = ::vk::makeExtent3D((UVec3 *)&imageParams.field_0x54);
  local_b0.depth = VVar6.depth;
  imageParams.extent.width = local_b0.depth;
  local_b0._0_8_ = VVar6._0_8_;
  imageParams.imageType = local_b0.width;
  imageParams.format = local_b0.height;
  imageParams.extent.height = 1;
  local_b0 = VVar6;
  imageParams.extent.depth =
       getNumLayers((this->super_BinaryAtomicInstanceBase).m_imageType,
                    &(this->super_BinaryAtomicInstanceBase).m_imageSize);
  imageParams.mipLevels = 1;
  imageParams.arrayLayers = 0;
  imageParams.samples = VK_SAMPLE_COUNT_8_BIT|VK_SAMPLE_COUNT_1_BIT;
  imageParams.tiling = VK_IMAGE_TILING_OPTIMAL;
  imageParams.usage = 0;
  imageParams.queueFamilyIndexCount = 0;
  imageParams._68_4_ = 0;
  imageParams.pQueueFamilyIndices._0_4_ = 0;
  pIVar4 = (Image *)operator_new(0x30);
  image::Image::Image(pIVar4,vk,device_00,allocator_00,(VkImageCreateInfo *)local_a0,
                      ::vk::MemoryRequirement::Any);
  de::DefaultDeleter<vkt::image::Image>::DefaultDeleter
            ((DefaultDeleter<vkt::image::Image> *)((long)&subresourceRange.baseArrayLayer + 3));
  de::details::MovePtr<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>::MovePtr();
  local_c0 = de::details::MovePtr::operator_cast_to_PtrData(&local_d0,(MovePtr *)pIVar4);
  data._8_8_ = in_stack_fffffffffffffe20;
  data.ptr = in_stack_fffffffffffffe18;
  de::details::MovePtr<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>::operator=
            (&this->m_intermResultsImage,data);
  de::details::MovePtr<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>::~MovePtr
            ((MovePtr<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_> *)&local_d0);
  layerCount = getNumLayers((this->super_BinaryAtomicInstanceBase).m_imageType,
                            &(this->super_BinaryAtomicInstanceBase).m_imageSize);
  ::vk::makeImageSubresourceRange((VkImageSubresourceRange *)auStack_fc,1,0,1,0,layerCount);
  pIVar4 = de::details::UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>::
           operator->(&(this->m_intermResultsImage).
                       super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>);
  pVVar5 = image::Image::get(pIVar4);
  image.m_internal = pVVar5->m_internal;
  imageViewType = mapImageViewType((this->super_BinaryAtomicInstanceBase).m_imageType);
  format = ::vk::mapTextureFormat(&(this->super_BinaryAtomicInstanceBase).m_format);
  subresourceRange_00.levelCount = subresourceRange.aspectMask;
  subresourceRange_00.baseArrayLayer = subresourceRange.baseMipLevel;
  subresourceRange_00.aspectMask = auStack_fc._0_4_;
  subresourceRange_00.baseMipLevel = auStack_fc._4_4_;
  subresourceRange_00.layerCount = subresourceRange.levelCount;
  makeImageView(&local_140,vk,device_00,image,imageViewType,format,subresourceRange_00);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_120,(Move *)&local_140);
  data_00.deleter.m_deviceIface = local_120.deleter.m_deviceIface;
  data_00.object.m_internal = local_120.object.m_internal;
  data_00.deleter.m_device._0_4_ = (int)local_120.deleter.m_device;
  data_00.deleter.m_device._4_4_ = (int)((ulong)local_120.deleter.m_device >> 0x20);
  data_00.deleter.m_allocator = local_120.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::operator=
            (&this->m_intermResultsImageView,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::~Move(&local_140);
  return;
}

Assistant:

void BinaryAtomicIntermValuesInstance::prepareResources (void)
{
	const VkDevice			device			= m_context.getDevice();
	const DeviceInterface&	deviceInterface = m_context.getDeviceInterface();
	Allocator&				allocator		= m_context.getDefaultAllocator();

	const UVec3 layerSize			= getLayerSize(m_imageType, m_imageSize);
	const bool  isCubeBasedImage	= (m_imageType == IMAGE_TYPE_CUBE || m_imageType == IMAGE_TYPE_CUBE_ARRAY);
	const UVec3 extendedLayerSize	= isCubeBasedImage	? UVec3(NUM_INVOCATIONS_PER_PIXEL * layerSize.x(), NUM_INVOCATIONS_PER_PIXEL * layerSize.y(), layerSize.z())
														: UVec3(NUM_INVOCATIONS_PER_PIXEL * layerSize.x(), layerSize.y(), layerSize.z());

	const VkImageCreateInfo imageParams =
	{
		VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO,		// VkStructureType			sType;
		DE_NULL,									// const void*				pNext;
		(m_imageType == IMAGE_TYPE_CUBE ||
		 m_imageType == IMAGE_TYPE_CUBE_ARRAY ?
		 (VkImageCreateFlags)VK_IMAGE_CREATE_CUBE_COMPATIBLE_BIT :
		 (VkImageCreateFlags)0u),					// VkImageCreateFlags		flags;
		mapImageType(m_imageType),					// VkImageType				imageType;
		mapTextureFormat(m_format),					// VkFormat					format;
		makeExtent3D(extendedLayerSize),			// VkExtent3D				extent;
		1u,											// deUint32					mipLevels;
		getNumLayers(m_imageType, m_imageSize),		// deUint32					arrayLayers;
		VK_SAMPLE_COUNT_1_BIT,						// VkSampleCountFlagBits	samples;
		VK_IMAGE_TILING_OPTIMAL,					// VkImageTiling			tiling;
		VK_IMAGE_USAGE_STORAGE_BIT |
		VK_IMAGE_USAGE_TRANSFER_SRC_BIT,
		VK_SHARING_MODE_EXCLUSIVE,					// VkSharingMode			sharingMode;
		0u,											// deUint32					queueFamilyIndexCount;
		DE_NULL,									// const deUint32*			pQueueFamilyIndices;
		VK_IMAGE_LAYOUT_UNDEFINED,					// VkImageLayout			initialLayout;
	};

	m_intermResultsImage = de::MovePtr<Image>(new Image(deviceInterface, device, allocator, imageParams, MemoryRequirement::Any));

	const VkImageSubresourceRange subresourceRange = makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, getNumLayers(m_imageType, m_imageSize));

	m_intermResultsImageView = makeImageView(deviceInterface, device, m_intermResultsImage->get(), mapImageViewType(m_imageType), mapTextureFormat(m_format), subresourceRange);
}